

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_CreateStringArray(char **strings,int count)

{
  cJSON *c;
  cJSON *pcVar1;
  ulong uVar2;
  cJSON *pcVar3;
  ulong uVar4;
  
  c = cJSON_CreateArray();
  uVar2 = 0;
  if (c == (cJSON *)0x0) {
LAB_0010791d:
    c = (cJSON *)0x0;
  }
  else {
    uVar4 = (ulong)(uint)count;
    if (count < 1) {
      uVar4 = uVar2;
    }
    pcVar3 = (cJSON *)0x0;
    for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
      pcVar1 = cJSON_CreateString(strings[uVar2]);
      if (pcVar1 == (cJSON *)0x0) {
        cJSON_Delete(c);
        goto LAB_0010791d;
      }
      if (uVar2 == 0) {
        c->child = pcVar1;
      }
      else {
        pcVar3->next = pcVar1;
        pcVar1->prev = pcVar3;
      }
      pcVar3 = pcVar1;
    }
  }
  return c;
}

Assistant:

cJSON *cJSON_CreateStringArray(const char **strings,int count)	{int i;cJSON *n=0,*p=0,*a=cJSON_CreateArray();for(i=0;a && i<count;i++){n=cJSON_CreateString(strings[i]);if(!n){cJSON_Delete(a);return 0;}if(!i)a->child=n;else suffix_object(p,n);p=n;}return a;}